

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help.cpp
# Opt level: O2

switch_strings * __thiscall
pstore::command_line::details::get_switch_strings_abi_cxx11_
          (switch_strings *__return_storage_ptr__,details *this,options_set *ops)

{
  _Rb_tree_header *p_Var1;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *str_00;
  int iVar2;
  string *str_01;
  size_t sVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mapped_type *this_00;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *ptVar4;
  _Rb_tree_node_base *p_Var5;
  option *this_01;
  char cVar6;
  ulong uVar7;
  long lStack_d0;
  char separator [3];
  string str;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  separator[2] = '\0';
  separator[0] = ',';
  separator[1] = ' ';
  p_Var5 = *(_Rb_tree_node_base **)(this + 0x18);
  do {
    if (p_Var5 == (_Rb_tree_node_base *)(this + 8)) {
      return __return_storage_ptr__;
    }
    this_01 = *(option **)(p_Var5 + 1);
    str_01 = option::name_abi_cxx11_(this_01);
    sVar3 = utf::length(str_01);
    str._M_dataplus._M_p = (pointer)&str.field_2;
    str._M_string_length = 0;
    str.field_2._M_local_buf[0] = '\0';
    if (sVar3 < 2) {
      std::operator+(&local_50,"-",str_01);
      std::__cxx11::string::operator=((string *)&str,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      lStack_d0 = 1;
    }
    else {
      std::operator+(&local_50,"--",str_01);
      std::__cxx11::string::operator=((string *)&str,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      lStack_d0 = 2;
    }
    iVar2 = (*this_01->_vptr_option[0xe])(this_01);
    uVar7 = lStack_d0 + sVar3;
    if ((char)iVar2 != '\0') {
      iVar2 = (*this_01->_vptr_option[0x11])(this_01);
      if ((czstring)CONCAT44(extraout_var,iVar2) != (czstring)0x0) {
        if (2 < uVar7) {
          std::__cxx11::string::append((char *)&str);
          uVar7 = uVar7 + 1;
        }
        cVar6 = (char)&str;
        std::__cxx11::string::push_back(cVar6);
        std::__cxx11::string::append((char *)&str);
        std::__cxx11::string::push_back(cVar6);
        sVar3 = utf::length((czstring)CONCAT44(extraout_var,iVar2));
        uVar7 = uVar7 + sVar3 + 2;
      }
    }
    sVar3 = utf::length(&str);
    if (sVar3 != uVar7) {
      assert_failed("pstore::utf::length (str) == code_points",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/command_line/help.cpp"
                    ,0x56);
    }
    std::__cxx11::string::string((string *)&name,(string *)&str);
    name.second = uVar7;
    std::__cxx11::string::~string((string *)&str);
    sVar3 = utf::length(&name.first);
    if (sVar3 != name.second) {
      assert_failed("pstore::utf::length (std::get<std::string> (name)) == std::get<std::size_t> (name)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/command_line/help.cpp"
                    ,0x8b);
    }
    iVar2 = (*this_01->_vptr_option[0xc])(this_01);
    if (CONCAT44(extraout_var_00,iVar2) != 0) {
      this_01 = *(option **)(CONCAT44(extraout_var_00,iVar2) + 0x88);
    }
    str._M_dataplus._M_p = (pointer)this_01;
    gsl::not_null<const_pstore::command_line::option_*>::ensure_invariant
              ((not_null<const_pstore::command_line::option_*> *)&str);
    this_00 = std::
              map<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>,_pstore::command_line::details::less_name,_std::allocator<std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>_>_>
              ::operator[](__return_storage_ptr__,(key_type *)&str);
    if (this_00->elements_ == 0) {
LAB_00113a88:
      std::
      tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
      ::
      tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_true>
                ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                  *)&str,&name);
      small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>
      ::push_back(this_00,(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                           *)&str);
      std::__cxx11::string::~string((string *)&str._M_string_length);
    }
    else {
      ptVar4 = small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>
               ::back(this_00);
      if (0x14 < (ptVar4->
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                 ).super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>
                 ._M_head_impl + name.second + 2) goto LAB_00113a88;
      std::operator+(&str,separator,&name.first);
      str_00 = &(ptVar4->
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                ).
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      ;
      std::__cxx11::string::append((string *)str_00);
      std::__cxx11::string::~string((string *)&str);
      (ptVar4->
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
      ).super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
      _M_head_impl = name.second +
                     (ptVar4->
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                     ).super__Tuple_impl<1UL,_unsigned_long>.
                     super__Head_base<1UL,_unsigned_long,_false>._M_head_impl + 2;
      sVar3 = utf::length(&str_00->_M_head_impl);
      if (sVar3 != (ptVar4->
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                   ).super__Tuple_impl<1UL,_unsigned_long>.
                   super__Head_base<1UL,_unsigned_long,_false>._M_head_impl) {
        assert_failed("pstore::utf::length (prev_string) == prev_code_points",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/command_line/help.cpp"
                      ,0x9e);
      }
    }
    std::__cxx11::string::~string((string *)&name);
    p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
  } while( true );
}

Assistant:

auto get_switch_strings (options_set const & ops) -> switch_strings {
                    constexpr char const separator[] = ", ";
                    constexpr auto separator_len = array_elements (separator) - 1U;

                    switch_strings names;
                    for (option const * op : ops) {
                        std::pair<std::string, std::size_t> name = option_string (*op);
                        PSTORE_ASSERT (pstore::utf::length (std::get<std::string> (name)) ==
                                       std::get<std::size_t> (name));

                        if (alias const * const alias = op->as_alias ()) {
                            op = alias->original ();
                        }

                        auto & v = names[op];
                        if (!v.empty ()) {
                            auto & prev = v.back ();
                            auto & prev_string = std::get<std::string> (prev);
                            auto & prev_code_points = std::get<std::size_t> (prev);

                            if (prev_code_points + separator_len + std::get<std::size_t> (name) <=
                                overlong_opt_max) {
                                // Fold this string onto the same output line as its predecessor.
                                prev_string += separator + std::get<std::string> (name);
                                prev_code_points += separator_len + std::get<std::size_t> (name);

                                PSTORE_ASSERT (pstore::utf::length (prev_string) ==
                                               prev_code_points);
                                continue;
                            }
                        }
                        v.push_back (name);
                    }
                    return names;
                }